

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void errorlimit(FuncState *fs,int limit,char *what)

{
  uint uVar1;
  lua_State *L_00;
  char *msg_00;
  char *local_48;
  char *where;
  int line;
  char *msg;
  lua_State *L;
  char *what_local;
  int limit_local;
  FuncState *fs_local;
  
  L_00 = fs->ls->L;
  uVar1 = fs->f->linedefined;
  if (uVar1 == 0) {
    local_48 = "main function";
  }
  else {
    local_48 = luaO_pushfstring(L_00,"function at line %d",(ulong)uVar1);
  }
  msg_00 = luaO_pushfstring(L_00,"too many %s (limit is %d) in %s",what,(ulong)(uint)limit,local_48)
  ;
  luaX_syntaxerror(fs->ls,msg_00);
}

Assistant:

static l_noret errorlimit (FuncState *fs, int limit, const char *what) {
  lua_State *L = fs->ls->L;
  const char *msg;
  int line = fs->f->linedefined;
  const char *where = (line == 0)
                      ? "main function"
                      : luaO_pushfstring(L, "function at line %d", line);
  msg = luaO_pushfstring(L, "too many %s (limit is %d) in %s",
                             what, limit, where);
  luaX_syntaxerror(fs->ls, msg);
}